

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<long_long> __thiscall
kj::anon_unknown_55::tryParseSigned(anon_unknown_55 *this,StringPtr *s,longlong min,longlong max)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  char *s_00;
  int __base;
  anon_union_8_1_a8c68091_for_NullableValue<long_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<long_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<long_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<long_long>_2 aVar4;
  Maybe<long_long> MVar5;
  longlong local_40;
  longlong value;
  char *endPtr;
  longlong local_28;
  longlong max_local;
  longlong min_local;
  StringPtr *s_local;
  
  local_28 = max;
  max_local = min;
  min_local = (longlong)s;
  s_local = (StringPtr *)this;
  bVar1 = StringPtr::operator==(s,(void *)0x0);
  if (bVar1) {
    Maybe<long_long>::Maybe((Maybe<long_long> *)this);
    aVar4 = extraout_RDX;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pcVar3 = StringPtr::begin((StringPtr *)min_local);
    s_00 = StringPtr::cStr((StringPtr *)min_local);
    bVar1 = isHex(s_00);
    __base = 10;
    if (bVar1) {
      __base = 0x10;
    }
    local_40 = strtoll(pcVar3,(char **)&value,__base);
    pcVar3 = StringPtr::end((StringPtr *)min_local);
    if ((char *)value == pcVar3) {
      piVar2 = __errno_location();
      if (((*piVar2 != 0x22) && (max_local <= local_40)) && (local_40 <= local_28)) {
        Maybe<long_long>::Maybe((Maybe<long_long> *)this,&local_40);
        aVar4 = extraout_RDX_01;
        goto LAB_00337583;
      }
    }
    Maybe<long_long>::Maybe((Maybe<long_long> *)this);
    aVar4 = extraout_RDX_00;
  }
LAB_00337583:
  MVar5.ptr.field_1.value = aVar4.value;
  MVar5.ptr._0_8_ = this;
  return (Maybe<long_long>)MVar5.ptr;
}

Assistant:

Maybe<long long> tryParseSigned(const StringPtr& s, long long min, long long max) {
  if (s == nullptr) { return kj::none; } // String does not contain valid number.
  char *endPtr;
  errno = 0;
  auto value = strtoll(s.begin(), &endPtr, isHex(s.cStr()) ? 16 : 10);
  if (endPtr != s.end() || errno == ERANGE || value < min || max < value) {
    return kj::none;
  }
  return value;
}